

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILayer.cpp
# Opt level: O0

void __thiscall ILayer::ILayer(ILayer *this,LayerMeta *_meta)

{
  int iVar1;
  undefined4 extraout_var;
  reference ppIVar2;
  int local_28;
  int idx;
  LayerMeta *_meta_local;
  ILayer *this_local;
  
  this->_vptr_ILayer = (_func_int **)&PTR__ILayer_00143aa0;
  std::vector<INeuron_*,_std::allocator<INeuron_*>_>::vector(&this->neurons);
  LayerStats::LayerStats(&this->stats);
  LayerMeta::LayerMeta(&this->meta,_meta);
  std::vector<INeuron_*,_std::allocator<INeuron_*>_>::resize(&this->neurons,(this->meta).size);
  for (local_28 = 0; (ulong)(long)local_28 < (this->meta).size; local_28 = local_28 + 1) {
    iVar1 = (**((this->meta).neuronBuilder)->_vptr_INeuronBuilder)();
    ppIVar2 = std::vector<INeuron_*,_std::allocator<INeuron_*>_>::operator[]
                        (&this->neurons,(long)local_28);
    *ppIVar2 = (value_type)CONCAT44(extraout_var,iVar1);
  }
  return;
}

Assistant:

ILayer::ILayer( LayerMeta _meta ) : meta( std::move(_meta) )
{
    neurons.resize( meta.size );
    for ( auto idx = 0; idx < meta.size; ++idx ) {
        neurons[idx] = meta.neuronBuilder.build();
    }
}